

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# include.hpp
# Opt level: O0

uchar RC(uchar c)

{
  uchar c_local;
  uchar local_1;
  
  switch(c) {
  case 'A':
  case 'a':
    local_1 = 'T';
    break;
  default:
    local_1 = 'N';
    break;
  case 'C':
  case 'c':
    local_1 = 'G';
    break;
  case 'G':
  case 'g':
    local_1 = 'C';
    break;
  case 'T':
  case 't':
    local_1 = 'A';
  }
  return local_1;
}

Assistant:

unsigned char RC(unsigned char c){

	switch(c){

		case 'A': case 'a': return 'T'; break;
		case 'C': case 'c': return 'G'; break;
		case 'G': case 'g': return 'C'; break;
		case 'T': case 't': return 'A'; break;
		default: break;

	}

	return 'N';

}